

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_sim.c
# Opt level: O0

int CVodeSetNonlinearSolverSensSim(void *cvode_mem,SUNNonlinearSolver NLS)

{
  int iVar1;
  N_Vector p_Var2;
  SUNNonlinearSolver in_RSI;
  CVodeMem in_RDI;
  int is;
  int retval;
  CVodeMem cv_mem;
  int local_28;
  int local_24;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x3a,"CVodeSetNonlinearSolverSensSim",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI == (SUNNonlinearSolver)0x0) {
    cvProcessError((CVodeMem)0x0,-0x16,0x42,"CVodeSetNonlinearSolverSensSim",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                   ,"NLS must be non-NULL");
    local_4 = -0x16;
  }
  else if (((in_RSI->ops->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
           (in_RSI->ops->solve ==
            (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0)
           ) || (in_RSI->ops->setsysfn ==
                 (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
    cvProcessError(in_RDI,-0x16,0x4b,"CVodeSetNonlinearSolverSensSim",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                   ,"NLS does not support required operations");
    local_4 = -0x16;
  }
  else if (in_RDI->cv_sensi == 0) {
    cvProcessError(in_RDI,-0x16,0x53,"CVodeSetNonlinearSolverSensSim",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                   ,"Forward sensitivity analysis not activated.");
    local_4 = -0x16;
  }
  else if (in_RDI->cv_ism == 1) {
    if ((in_RDI->NLSsim != (SUNNonlinearSolver)0x0) && (in_RDI->ownNLSsim != 0)) {
      SUNNonlinSolFree(in_RDI->NLSsim);
    }
    in_RDI->NLSsim = in_RSI;
    in_RDI->ownNLSsim = 0;
    iVar1 = SUNNonlinSolGetType(in_RSI);
    if (iVar1 == 0) {
      local_24 = SUNNonlinSolSetSysFn(in_RDI->NLSsim,cvNlsResidualSensSim);
    }
    else {
      iVar1 = SUNNonlinSolGetType(in_RSI);
      if (iVar1 != 1) {
        cvProcessError(in_RDI,-0x16,0x78,"CVodeSetNonlinearSolverSensSim",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                       ,"Invalid nonlinear solver type");
        return -0x16;
      }
      local_24 = SUNNonlinSolSetSysFn(in_RDI->NLSsim,cvNlsFPFunctionSensSim);
    }
    if (local_24 == 0) {
      iVar1 = SUNNonlinSolSetConvTestFn(in_RDI->NLSsim,cvNlsConvTestSensSim,in_RDI);
      if (iVar1 == 0) {
        iVar1 = SUNNonlinSolSetMaxIters(in_RDI->NLSsim,3);
        if (iVar1 == 0) {
          if (in_RDI->simMallocDone == 0) {
            p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->cv_Ns + 1,in_RDI->cv_sunctx);
            in_RDI->zn0Sim = p_Var2;
            if (in_RDI->zn0Sim == (N_Vector)0x0) {
              cvProcessError(in_RDI,-0x14,0x9e,"CVodeSetNonlinearSolverSensSim",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                             ,"A memory request failed.");
              return -0x14;
            }
            p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->cv_Ns + 1,in_RDI->cv_sunctx);
            in_RDI->ycorSim = p_Var2;
            if (in_RDI->ycorSim == (N_Vector)0x0) {
              N_VDestroy(in_RDI->zn0Sim);
              cvProcessError(in_RDI,-0x14,0xa8,"CVodeSetNonlinearSolverSensSim",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                             ,"A memory request failed.");
              return -0x14;
            }
            p_Var2 = (N_Vector)N_VNewEmpty_SensWrapper(in_RDI->cv_Ns + 1,in_RDI->cv_sunctx);
            in_RDI->ewtSim = p_Var2;
            if (in_RDI->ewtSim == (N_Vector)0x0) {
              N_VDestroy(in_RDI->zn0Sim);
              N_VDestroy(in_RDI->ycorSim);
              cvProcessError(in_RDI,-0x14,0xb3,"CVodeSetNonlinearSolverSensSim",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                             ,"A memory request failed.");
              return -0x14;
            }
            in_RDI->simMallocDone = 1;
          }
          **in_RDI->zn0Sim->content = in_RDI->cv_zn[0];
          **in_RDI->ycorSim->content = in_RDI->cv_acor;
          **in_RDI->ewtSim->content = in_RDI->cv_ewt;
          for (local_28 = 0; local_28 < in_RDI->cv_Ns; local_28 = local_28 + 1) {
            *(N_Vector *)(*in_RDI->zn0Sim->content + (long)(local_28 + 1) * 8) =
                 in_RDI->cv_znS[0][local_28];
            *(N_Vector *)(*in_RDI->ycorSim->content + (long)(local_28 + 1) * 8) =
                 in_RDI->cv_acorS[local_28];
            *(N_Vector *)(*in_RDI->ewtSim->content + (long)(local_28 + 1) * 8) =
                 in_RDI->cv_ewtS[local_28];
          }
          in_RDI->cv_acnrmcur = 0;
          if (in_RDI->cv_f == (CVRhsFn)0x0) {
            cvProcessError(in_RDI,-0x16,0xcd,"CVodeSetNonlinearSolverSensSim",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                           ,"The ODE RHS function is NULL");
            local_4 = -0x16;
          }
          else {
            in_RDI->nls_f = in_RDI->cv_f;
            local_4 = 0;
          }
        }
        else {
          cvProcessError(in_RDI,-0x16,0x92,"CVodeSetNonlinearSolverSensSim",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                         ,"Setting maximum number of nonlinear iterations failed");
          local_4 = -0x16;
        }
      }
      else {
        cvProcessError(in_RDI,-0x16,0x89,"CVodeSetNonlinearSolverSensSim",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                       ,"Setting convergence test function failed");
        local_4 = -0x16;
      }
    }
    else {
      cvProcessError(in_RDI,-0x16,0x7f,"CVodeSetNonlinearSolverSensSim",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                     ,"Setting nonlinear system function failed");
      local_4 = -0x16;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0x5b,"CVodeSetNonlinearSolverSensSim",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_sim.c"
                   ,"Sensitivity solution method is not CV_SIMULTANEOUS");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSetNonlinearSolverSensSim(void* cvode_mem, SUNNonlinearSolver NLS)
{
  CVodeMem cv_mem;
  int retval, is;

  /* Return immediately if CVode memory is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    cvProcessError(NULL, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS must be non-NULL");
    return (CV_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS does not support required operations");
    return (CV_ILL_INPUT);
  }

  /* check that sensitivities were initialized */
  if (!(cv_mem->cv_sensi))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_ILL_INPUT);
  }

  /* check that simultaneous corrector was selected */
  if (cv_mem->cv_ism != CV_SIMULTANEOUS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Sensitivity solution method is not CV_SIMULTANEOUS");
    return (CV_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((cv_mem->NLSsim != NULL) && (cv_mem->ownNLSsim))
  {
    retval = SUNNonlinSolFree(cv_mem->NLSsim);
  }

  /* set SUNNonlinearSolver pointer */
  cv_mem->NLSsim = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, CVODE will set the flag to SUNTRUE after this function returns. */
  cv_mem->ownNLSsim = SUNFALSE;

  /* set the nonlinear system function */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLSsim, cvNlsResidualSensSim);
  }
  else if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_FIXEDPOINT)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLSsim, cvNlsFPFunctionSensSim);
  }
  else
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid nonlinear solver type");
    return (CV_ILL_INPUT);
  }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting nonlinear system function failed");
    return (CV_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(cv_mem->NLSsim, cvNlsConvTestSensSim,
                                     cvode_mem);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting convergence test function failed");
    return (CV_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(cv_mem->NLSsim, NLS_MAXCOR);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting maximum number of nonlinear iterations failed");
    return (CV_ILL_INPUT);
  }

  /* create vector wrappers if necessary */
  if (cv_mem->simMallocDone == SUNFALSE)
  {
    cv_mem->zn0Sim = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns + 1,
                                             cv_mem->cv_sunctx);
    if (cv_mem->zn0Sim == NULL)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->ycorSim = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns + 1,
                                              cv_mem->cv_sunctx);
    if (cv_mem->ycorSim == NULL)
    {
      N_VDestroy(cv_mem->zn0Sim);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->ewtSim = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns + 1,
                                             cv_mem->cv_sunctx);
    if (cv_mem->ewtSim == NULL)
    {
      N_VDestroy(cv_mem->zn0Sim);
      N_VDestroy(cv_mem->ycorSim);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->simMallocDone = SUNTRUE;
  }

  /* attach vectors to vector wrappers */
  NV_VEC_SW(cv_mem->zn0Sim, 0)  = cv_mem->cv_zn[0];
  NV_VEC_SW(cv_mem->ycorSim, 0) = cv_mem->cv_acor;
  NV_VEC_SW(cv_mem->ewtSim, 0)  = cv_mem->cv_ewt;

  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    NV_VEC_SW(cv_mem->zn0Sim, is + 1)  = cv_mem->cv_znS[0][is];
    NV_VEC_SW(cv_mem->ycorSim, is + 1) = cv_mem->cv_acorS[is];
    NV_VEC_SW(cv_mem->ewtSim, is + 1)  = cv_mem->cv_ewtS[is];
  }

  /* Reset the acnrmcur flag to SUNFALSE */
  cv_mem->cv_acnrmcur = SUNFALSE;

  /* Set the nonlinear system RHS function */
  if (!(cv_mem->cv_f))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "The ODE RHS function is NULL");
    return (CV_ILL_INPUT);
  }
  cv_mem->nls_f = cv_mem->cv_f;

  return (CV_SUCCESS);
}